

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O2

void __thiscall
solitaire::SolitaireEmptyHandTest_trySelectNextStockPileCard_Test::TestBody
          (SolitaireEmptyHandTest_trySelectNextStockPileCard_Test *this)

{
  HistoryTrackerMock *this_00;
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_01;
  StockPileMock *in_RSI;
  StockPileMock *pile;
  InSequence seq;
  InSequence local_51;
  undefined1 local_50 [32];
  MatcherBase<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
  local_30;
  StrictMock<solitaire::archivers::SnapshotMock> *local_18;
  
  testing::InSequence::InSequence(&local_51);
  local_30.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)
       piles::StockPileMock::gmock_getCards
                 ((MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                   *)(this->super_SolitaireEmptyHandTest).super_SolitaireTest.stockPileMock.
                     super___shared_ptr<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,in_RSI);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
            ::InternalExpectedAt
                      ((MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                        *)&local_30,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0x151,"*stockPileMock","getCards()");
  local_18 = (StrictMock<solitaire::archivers::SnapshotMock> *)(anonymous_namespace)::oneCard;
  testing::internal::ReturnRefAction::operator_cast_to_Action
            ((Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
              *)local_50,(ReturnRefAction *)&local_18);
  testing::internal::
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  ::WillOnce(this_01,(Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                      *)local_50);
  std::_Function_base::~_Function_base((_Function_base *)local_50);
  pile = (this->super_SolitaireEmptyHandTest).super_SolitaireTest.stockPileMock.
         super___shared_ptr<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  SolitaireEmptyHandTest::expectSnapshotCreation<solitaire::piles::StockPileMock>
            (&this->super_SolitaireEmptyHandTest,pile,
             &(this->super_SolitaireEmptyHandTest).snapshotMock);
  local_50._0_8_ =
       piles::StockPileMock::gmock_trySelectNextCard
                 ((MockSpec<void_()> *)
                  (this->super_SolitaireEmptyHandTest).super_SolitaireTest.stockPileMock.
                  super___shared_ptr<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,pile);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            ((MockSpec<void_()> *)local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x153,"*stockPileMock","trySelectNextCard()");
  this_00 = &((this->super_SolitaireEmptyHandTest).super_SolitaireTest.historyTrackerMock.rawPointer
             )->super_HistoryTrackerMock;
  local_18 = (this->super_SolitaireEmptyHandTest).snapshotMock.rawPointer;
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            ((Matcher<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
              *)&local_30,(PointerMatcher *)&local_18);
  archivers::HistoryTrackerMock::gmock_save
            ((MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
              *)local_50,this_00,
             (Matcher<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
              *)&local_30);
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  ::InternalExpectedAt
            ((MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
              *)local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x154,"*historyTrackerMock","save(Pointer(snapshotMock.get()))");
  testing::internal::
  MatcherBase<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
  ::~MatcherBase((MatcherBase<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
                  *)(local_50 + 8));
  testing::internal::
  MatcherBase<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
  ::~MatcherBase(&local_30);
  Solitaire::trySelectNextStockPileCard
            (&(this->super_SolitaireEmptyHandTest).super_SolitaireTest.solitaire);
  testing::InSequence::~InSequence(&local_51);
  return;
}

Assistant:

TEST_F(SolitaireEmptyHandTest, trySelectNextStockPileCard) {
    InSequence seq;
    EXPECT_CALL(*stockPileMock, getCards()).WillOnce(ReturnRef(oneCard));
    expectSnapshotCreation(*stockPileMock, snapshotMock);
    EXPECT_CALL(*stockPileMock, trySelectNextCard());
    EXPECT_CALL(*historyTrackerMock, save(Pointer(snapshotMock.get())));

    solitaire.trySelectNextStockPileCard();
}